

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

MatrixOrder
deqp::gles31::Functional::anon_unknown_0::getMatrixOrderFromPath
          (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           *path)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  InterfaceBlock *pIVar4;
  VariableDeclaration *pVVar5;
  MatrixOrder local_24;
  int local_20;
  MatrixOrder matOrder;
  int pathNdx;
  MatrixOrder order;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *path_local;
  
  matOrder = MATRIXORDER_LAST;
  local_20 = 0;
  do {
    sVar2 = std::
            vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
            ::size(path);
    if ((int)sVar2 <= local_20) {
      return matOrder;
    }
    pvVar3 = std::
             vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
             ::operator[](path,(long)local_20);
    bVar1 = ProgramInterfaceDefinition::VariablePathComponent::isInterfaceBlock(pvVar3);
    if (bVar1) {
      pvVar3 = std::
               vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
               ::operator[](path,(long)local_20);
      pIVar4 = ProgramInterfaceDefinition::VariablePathComponent::getInterfaceBlock(pvVar3);
      local_24 = (pIVar4->layout).matrixOrder;
    }
    else {
      pvVar3 = std::
               vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
               ::operator[](path,(long)local_20);
      bVar1 = ProgramInterfaceDefinition::VariablePathComponent::isDeclaration(pvVar3);
      if (bVar1) {
        pvVar3 = std::
                 vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                 ::operator[](path,(long)local_20);
        pVVar5 = ProgramInterfaceDefinition::VariablePathComponent::getDeclaration(pvVar3);
        local_24 = (pVVar5->layout).matrixOrder;
      }
      else {
        pvVar3 = std::
                 vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                 ::operator[](path,(long)local_20);
        bVar1 = ProgramInterfaceDefinition::VariablePathComponent::isVariableType(pvVar3);
        if (!bVar1) {
          return MATRIXORDER_LAST;
        }
        local_24 = MATRIXORDER_LAST;
      }
    }
    if (local_24 != MATRIXORDER_LAST) {
      matOrder = local_24;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

static glu::MatrixOrder getMatrixOrderFromPath (const std::vector<VariablePathComponent>& path)
{
	glu::MatrixOrder order = glu::MATRIXORDER_LAST;

	// inherit majority
	for (int pathNdx = 0; pathNdx < (int)path.size(); ++pathNdx)
	{
		glu::MatrixOrder matOrder;

		if (path[pathNdx].isInterfaceBlock())
			matOrder = path[pathNdx].getInterfaceBlock()->layout.matrixOrder;
		else if (path[pathNdx].isDeclaration())
			matOrder = path[pathNdx].getDeclaration()->layout.matrixOrder;
		else if (path[pathNdx].isVariableType())
			matOrder = glu::MATRIXORDER_LAST;
		else
		{
			DE_ASSERT(false);
			return glu::MATRIXORDER_LAST;
		}

		if (matOrder != glu::MATRIXORDER_LAST)
			order = matOrder;
	}

	return order;
}